

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::changeCostsInterface(Highs *this,HighsIndexCollection *index_collection,double *cost)

{
  HighsLogOptions *log_options;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  HighsInt cost_scale;
  bool bVar1;
  uint uVar2;
  HighsStatus HVar3;
  ulong uVar4;
  ulong uVar5;
  HighsStatus HVar6;
  double dVar7;
  bool local_has_infinite_cost;
  vector<double,_std::allocator<double>_> local_colCost;
  bool local_f9;
  HighsIndexCollection *local_f8;
  vector<double,_std::allocator<double>_> local_f0;
  string local_d8;
  string local_b8;
  HighsLogOptions local_98;
  
  uVar2 = dataSize(index_collection);
  if ((int)uVar2 < 1) {
    return kOk;
  }
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  local_f8 = index_collection;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"column costs","");
  bVar1 = doubleUserDataNotNull(log_options,cost,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (bVar1) {
    return kError;
  }
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_f0,cost,cost + uVar2,
             (allocator_type *)&local_d8);
  local_f9 = false;
  local_98.log_stream = log_options->log_stream;
  local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_98.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_98.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  this_00 = &local_98.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
  local_98.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_98.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  HVar3 = assessCosts(&this->options_,0,local_f8,&local_f0,&local_f9,
                      (this->options_).super_HighsOptionsStruct.infinite_cost);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"assessCosts","");
  HVar3 = interpretCallStatus(&local_98,HVar3,kOk,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  HVar6 = kError;
  if (HVar3 != kError) {
    cost_scale = (this->model_).lp_.user_cost_scale_;
    if (cost_scale != 0) {
      bVar1 = costScaleOk(&local_f0,cost_scale,
                          (this->options_).super_HighsOptionsStruct.infinite_cost);
      if (!bVar1) {
        highsLogUser(log_options,kError,"User cost scaling yields infinite cost\n");
        goto LAB_00231f29;
      }
      dVar7 = ldexp(1.0,(this->model_).lp_.user_cost_scale_);
      uVar4 = 1;
      if (1 < (int)uVar2) {
        uVar4 = (ulong)uVar2;
      }
      uVar5 = 0;
      do {
        local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar5] =
             local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5] * dVar7;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    changeLpCosts(&(this->model_).lp_,local_f8,&local_f0,
                  (this->options_).super_HighsOptionsStruct.infinite_cost);
    bVar1 = true;
    if ((this->model_).lp_.has_infinite_cost_ == false) {
      bVar1 = local_f9;
    }
    (this->model_).lp_.has_infinite_cost_ = bVar1;
    invalidateModelStatusSolutionAndInfo(this);
    HVar6 = kOk;
    HEkk::updateStatus(&this->ekk_instance_,kNewCosts);
  }
LAB_00231f29:
  if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar6;
}

Assistant:

HighsStatus Highs::changeCostsInterface(HighsIndexCollection& index_collection,
                                        const double* cost) {
  HighsInt num_cost = dataSize(index_collection);
  // If a non-positive number of costs (may) need changing nothing needs to be
  // done
  if (num_cost <= 0) return HighsStatus::kOk;
  if (doubleUserDataNotNull(options_.log_options, cost, "column costs"))
    return HighsStatus::kError;
  // Take a copy of the cost that can be normalised
  std::vector<double> local_colCost{cost, cost + num_cost};
  HighsStatus return_status = HighsStatus::kOk;
  bool local_has_infinite_cost = false;
  return_status = interpretCallStatus(
      options_.log_options,
      assessCosts(options_, 0, index_collection, local_colCost,
                  local_has_infinite_cost, options_.infinite_cost),
      return_status, "assessCosts");
  if (return_status == HighsStatus::kError) return return_status;
  HighsLp& lp = model_.lp_;
  if (lp.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!costScaleOk(local_colCost, lp.user_cost_scale_,
                     options_.infinite_cost)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User cost scaling yields infinite cost\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, lp.user_cost_scale_);
    for (HighsInt iCol = 0; iCol < num_cost; iCol++)
      local_colCost[iCol] *= cost_scale_value;
  }
  changeLpCosts(lp, index_collection, local_colCost, options_.infinite_cost);

  // Interpret possible introduction of infinite costs
  lp.has_infinite_cost_ = lp.has_infinite_cost_ || local_has_infinite_cost;
  assert(lp.has_infinite_cost_ == lp.hasInfiniteCost(options_.infinite_cost));

  // Deduce the consequences of new costs
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kNewCosts);
  return HighsStatus::kOk;
}